

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O2

void list_store_get(t_list_store *x,float f1,float f2)

{
  int iVar1;
  _outlet *p_Var2;
  t_atom *to;
  uint count;
  t_atom *ptVar3;
  int onset;
  t_symbol *aptStack_680 [199];
  undefined1 local_48 [8];
  t_alist y;
  
  ptVar3 = (t_atom *)local_48;
  onset = (int)f1;
  count = (uint)f2;
  if (count == 0) {
    count = 1;
  }
  else if (((int)count < 0) &&
          (iVar1 = (x->x_alist).l_n, count = iVar1 - onset, count == 0 || iVar1 < onset))
  goto LAB_0017cf9e;
  if ((-1 < onset) && ((int)(count + onset) <= (x->x_alist).l_n)) {
    if (count < 100) {
      ptVar3 = (t_atom *)(local_48 + -(ulong)(count << 4));
      to = ptVar3;
    }
    else {
      to = (t_atom *)getbytes((ulong)count << 4);
    }
    if ((x->x_alist).l_npointer == 0) {
      ptVar3[-1].a_w.w_symbol = (t_symbol *)0x17d034;
      alist_toatoms(&x->x_alist,to,onset,count);
      p_Var2 = x->x_out1;
      ptVar3[-1].a_w.w_symbol = (t_symbol *)0x17d049;
      outlet_list(p_Var2,&s_list,count,to);
    }
    else {
      ptVar3[-1].a_w.w_symbol = (t_symbol *)0x17cff5;
      alist_clone(&x->x_alist,(t_alist *)local_48,onset,count);
      ptVar3[-1].a_w.w_symbol = (t_symbol *)0x17d008;
      alist_toatoms((t_alist *)local_48,to,0,count);
      p_Var2 = x->x_out1;
      ptVar3[-1].a_w.w_symbol = (t_symbol *)0x17d01d;
      outlet_list(p_Var2,&s_list,count,to);
      ptVar3[-1].a_w.w_symbol = (t_symbol *)0x17d025;
      alist_clear((t_alist *)local_48);
    }
    if (99 < count) {
      ptVar3[-1].a_w.w_symbol = (t_symbol *)0x17d05d;
      freebytes(to,(ulong)count << 4);
    }
    return;
  }
LAB_0017cf9e:
  outlet_bang(x->x_out2);
  return;
}

Assistant:

static void list_store_get(t_list_store *x, float f1, float f2)
{
    t_atom *outv;
    int onset = f1, outc = f2;
    if (!outc)
        outc = 1; /* default */
    else if (outc < 0)
    {
        outc = x->x_alist.l_n - onset; /* till the end of the list */
        if (outc <= 0) /* onset out of range */
        {
            outlet_bang(x->x_out2);
            return;
        }
    }
    if (onset < 0 || (onset + outc > x->x_alist.l_n))
    {
        outlet_bang(x->x_out2);
        return;
    }
    ATOMS_ALLOCA(outv, outc);
    if (x->x_alist.l_npointer)
    {
        t_alist y;
        alist_clone(&x->x_alist, &y, onset, outc);
        alist_toatoms(&y, outv, 0, outc);
        outlet_list(x->x_out1, &s_list, outc, outv);
        alist_clear(&y);
    }
    else
    {
        alist_toatoms(&x->x_alist, outv, onset, outc);
        outlet_list(x->x_out1, &s_list, outc, outv);
    }
    ATOMS_FREEA(outv, outc);
}